

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O1

void nhdp_interfaces_init(oonf_rfc5444_protocol *p)

{
  avl_init(&_interface_tree,avl_comp_strcasecmp,0);
  avl_init(&_ifaddr_tree,avl_comp_ifaddr,1);
  oonf_class_add(&_interface_info);
  oonf_class_add(&_addr_info);
  oonf_timer_add(&_interface_hello_timer);
  oonf_timer_add(&_removed_address_hold_timer);
  _protocol = p;
  return;
}

Assistant:

void
nhdp_interfaces_init(struct oonf_rfc5444_protocol *p) {
  avl_init(&_interface_tree, avl_comp_strcasecmp, false);
  avl_init(&_ifaddr_tree, avl_comp_ifaddr, true);
  oonf_class_add(&_interface_info);
  oonf_class_add(&_addr_info);
  oonf_timer_add(&_interface_hello_timer);
  oonf_timer_add(&_removed_address_hold_timer);

  /* default protocol should be always available */
  _protocol = p;
}